

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtins.cpp
# Opt level: O0

Sexp * Builtin_Error(Sexp *form)

{
  char *pcVar1;
  bool bVar2;
  JetRuntimeException *pJVar3;
  allocator local_71;
  string local_70 [38];
  undefined1 local_4a;
  allocator local_49;
  string local_48 [48];
  ContractFrameProtector local_18;
  ContractFrameProtector __contract_frame;
  Sexp *form_local;
  
  __contract_frame.protected_frame = (ContractFrame *)form;
  ContractFrameProtector::ContractFrameProtector(&local_18,"Builtin_Error");
  ContractFrameProtector::AddContract(&local_18,NoGc);
  bVar2 = Sexp::IsString((Sexp *)__contract_frame.protected_frame);
  if (!bVar2) {
    local_4a = 1;
    pJVar3 = (JetRuntimeException *)__cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_48,"error called with non-string value",&local_49);
    JetRuntimeException::JetRuntimeException(pJVar3,(string *)local_48);
    local_4a = 0;
    __cxa_throw(pJVar3,&JetRuntimeException::typeinfo,JetRuntimeException::~JetRuntimeException);
  }
  pJVar3 = (JetRuntimeException *)__cxa_allocate_exception(0x28);
  pcVar1 = (__contract_frame.protected_frame)->function_name;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,pcVar1,&local_71);
  JetRuntimeException::JetRuntimeException(pJVar3,(string *)local_70);
  __cxa_throw(pJVar3,&JetRuntimeException::typeinfo,JetRuntimeException::~JetRuntimeException);
}

Assistant:

Sexp *Builtin_Error(Sexp *form) {
  CONTRACT { FORBID_GC; }